

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

string * __thiscall kratos::FSM::dot_graph_abi_cxx11_(string *__return_storage_ptr__,FSM *this)

{
  string *__return_storage_ptr___00;
  pointer *__return_storage_ptr___01;
  FSMState *pFVar1;
  Var *pVVar2;
  pointer ppFVar3;
  __type _Var4;
  ostream *poVar5;
  mapped_type *pmVar6;
  undefined1 auVar7 [8];
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer ppVar8;
  basic_string_view<char> bVar9;
  string_view format_str;
  string_view format_str_00;
  string_view format_str_01;
  string_view format_str_02;
  string_view format_str_03;
  string_view format_str_04;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  stringstream local_2f8 [8];
  stringstream stream;
  map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  state_colors;
  undefined1 local_120 [8];
  string start_state_name;
  undefined1 local_e8 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> color_str_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> color_str;
  string local_88;
  string local_68;
  ulong local_48;
  char local_38 [8];
  char indent [5];
  
  builtin_strncpy(local_38,"    ",5);
  std::__cxx11::stringstream::stringstream(local_2f8);
  poVar5 = std::operator<<((ostream *)&stream.field_0x8,"digraph ");
  poVar5 = std::operator<<(poVar5,(string *)this);
  poVar5 = std::operator<<(poVar5," {");
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_38);
  poVar5 = std::operator<<(poVar5,"rankdir=LR;");
  poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
  std::endl<char,std::char_traits<char>>(poVar5);
  local_120 = (undefined1  [8])&start_state_name._M_string_length;
  start_state_name._M_dataplus._M_p = (pointer)0x0;
  start_state_name._M_string_length._0_1_ = 0;
  pFVar1 = (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (pFVar1 != (FSMState *)0x0) {
    FSMState::handle_name_abi_cxx11_(&local_68,pFVar1);
    std::__cxx11::string::operator=((string *)local_120,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_e8,this,true);
  get_state_color((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                   *)&stream.field_0x180,
                  (vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_e8);
  if (start_state_name._M_dataplus._M_p != (pointer)0x0) {
    local_68._M_dataplus._M_p =
         (pointer)(this->start_state_).
                  super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    pmVar6 = std::
             map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
             ::at((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                   *)&stream.field_0x180,(key_type *)&local_68);
    local_68._M_dataplus._M_p = (pointer)(ulong)pmVar6->R;
    local_68.field_2._M_allocated_capacity = (size_type)pmVar6->G;
    local_48 = (ulong)pmVar6->B;
    bVar9 = fmt::v7::to_string_view<char,_0>("#{0:02X}{1:02X}{2:02X}");
    format_str.data_ = (char *)bVar9.size_;
    format_str.size_ = 0x222;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.values_ = in_R9.values_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)((long)&color_str_1.field_2 + 8),(detail *)bVar9.data_,format_str,args);
    poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_38);
    FSMState::handle_name_abi_cxx11_
              (&local_88,
               (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr);
    local_68._M_dataplus._M_p = local_88._M_dataplus._M_p;
    local_68._M_string_length = local_88._M_string_length;
    local_68.field_2._M_allocated_capacity = color_str_1.field_2._8_8_;
    local_68.field_2._8_8_ = color_str._M_dataplus._M_p;
    bVar9 = fmt::v7::to_string_view<char,_0>
                      (
                      "node [shape=doublecircle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};"
                      );
    format_str_00.data_ = (char *)bVar9.size_;
    format_str_00.size_ = 0xdd;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_68;
    fmt::v7::detail::vformat_abi_cxx11_
              ((string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)bVar9.data_,
               format_str_00,args_00);
    poVar5 = std::operator<<(poVar5,(string *)
                                    &states.
                                     super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::__cxx11::string::~string
              ((string *)
               &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)(color_str_1.field_2._M_local_buf + 8));
  }
  ppFVar3 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  __return_storage_ptr___00 = (string *)(color_str_1.field_2._M_local_buf + 8);
  for (auVar7 = local_e8; auVar7 != (undefined1  [8])ppFVar3;
      auVar7 = (undefined1  [8])((long)auVar7 + 8)) {
    FSMState::handle_name_abi_cxx11_(__return_storage_ptr___00,*(FSMState **)auVar7);
    _Var4 = std::operator==(__return_storage_ptr___00,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_120);
    if (!_Var4) {
      pmVar6 = std::
               map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
               ::at((map<kratos::FSMState_*,_kratos::color::Color,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
                     *)&stream.field_0x180,(key_type *)auVar7);
      local_68._M_dataplus._M_p = (pointer)(ulong)pmVar6->R;
      local_68.field_2._M_allocated_capacity = (size_type)pmVar6->G;
      local_48 = (ulong)pmVar6->B;
      bVar9 = fmt::v7::to_string_view<char,_0>("#{0:02X}{1:02X}{2:02X}");
      format_str_01.data_ = (char *)bVar9.size_;
      format_str_01.size_ = 0x222;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_01.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)bVar9.data_,
                 format_str_01,args_01);
      poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_38);
      local_68._M_dataplus._M_p = (pointer)color_str_1.field_2._8_8_;
      local_68._M_string_length = (size_type)color_str._M_dataplus._M_p;
      local_68.field_2._M_allocated_capacity =
           (size_type)
           states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.field_2._8_8_ = color_str_1._M_dataplus._M_p;
      bVar9 = fmt::v7::to_string_view<char,_0>
                        ("node [shape=circle, label=\"{0}\", style=filled, fillcolor=\"{1}\"] {0};")
      ;
      format_str_02.data_ = (char *)bVar9.size_;
      format_str_02.size_ = 0xdd;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.values_ = in_R9.values_;
      args_02.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&local_68;
      fmt::v7::detail::vformat_abi_cxx11_(&local_88,(detail *)bVar9.data_,format_str_02,args_02);
      poVar5 = std::operator<<(poVar5,(string *)&local_88);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_88);
      std::__cxx11::string::~string
                ((string *)
                 &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::__cxx11::string::~string((string *)__return_storage_ptr___00);
  }
  std::endl<char,std::char_traits<char>>((ostream *)&stream.field_0x8);
  __return_storage_ptr___01 =
       &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  for (auVar7 = local_e8;
      auVar7 != (undefined1  [8])
                states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      auVar7 = (undefined1  [8])((long)auVar7 + 8)) {
    pFVar1 = *(FSMState **)auVar7;
    FSMState::handle_name_abi_cxx11_((string *)((long)&color_str_1.field_2 + 8),pFVar1);
    start_state_name.field_2._8_8_ =
         (pFVar1->transitions_).
         super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar8 = (pFVar1->transitions_).
                  super__Vector_base<std::pair<kratos::Var_*,_kratos::FSMState_*>,_std::allocator<std::pair<kratos::Var_*,_kratos::FSMState_*>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppVar8 != (pointer)start_state_name.field_2._8_8_; ppVar8 = ppVar8 + 1) {
      pVVar2 = ppVar8->first;
      pFVar1 = ppVar8->second;
      if (pVVar2 == (Var *)0x0) {
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_38);
        FSMState::handle_name_abi_cxx11_(&local_88,pFVar1);
        local_68._M_dataplus._M_p = (pointer)color_str_1.field_2._8_8_;
        local_68._M_string_length = (size_type)color_str._M_dataplus._M_p;
        local_68.field_2._M_allocated_capacity = (size_type)local_88._M_dataplus._M_p;
        local_68.field_2._8_8_ = local_88._M_string_length;
        bVar9 = fmt::v7::to_string_view<char,_0>("{0}    ->  {1};");
        format_str_04.data_ = (char *)bVar9.size_;
        format_str_04.size_ = 0xdd;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_04.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_68;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)__return_storage_ptr___01,(detail *)bVar9.data_,format_str_04,args_04);
        poVar5 = std::operator<<(poVar5,(string *)__return_storage_ptr___01);
        std::endl<char,std::char_traits<char>>(poVar5);
        this_00 = (string *)__return_storage_ptr___01;
      }
      else {
        poVar5 = std::operator<<((ostream *)&stream.field_0x8,local_38);
        FSMState::handle_name_abi_cxx11_(&local_88,pFVar1);
        (**(code **)((long)(pVVar2->super_IRNode)._vptr_IRNode + 0xf8))
                  (&state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count,pVVar2);
        local_68._M_dataplus._M_p = (pointer)color_str_1.field_2._8_8_;
        local_68._M_string_length = (size_type)color_str._M_dataplus._M_p;
        local_68.field_2._M_allocated_capacity = (size_type)local_88._M_dataplus._M_p;
        local_68.field_2._8_8_ = local_88._M_string_length;
        local_48 = state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
        bVar9 = fmt::v7::to_string_view<char,_0>("{0}    ->  {1} [ label = \"{2}\" ];");
        format_str_03.data_ = (char *)bVar9.size_;
        format_str_03.size_ = 0xddd;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .field_1.args_ = in_R9.args_;
        args_03.
        super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
        .desc_ = (unsigned_long_long)&local_68;
        fmt::v7::detail::vformat_abi_cxx11_
                  ((string *)__return_storage_ptr___01,(detail *)bVar9.data_,format_str_03,args_03);
        poVar5 = std::operator<<(poVar5,(string *)__return_storage_ptr___01);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::string::~string((string *)__return_storage_ptr___01);
        this_00 = (string *)&state_colors._M_t._M_impl.super__Rb_tree_header._M_node_count;
      }
      std::__cxx11::string::~string(this_00);
      std::__cxx11::string::~string((string *)&local_88);
    }
    std::__cxx11::string::~string((string *)(color_str_1.field_2._M_local_buf + 8));
  }
  poVar5 = std::operator<<((ostream *)&stream.field_0x8,"}");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  std::
  _Rb_tree<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_kratos::color::Color>,_std::_Select1st<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
  ::~_Rb_tree((_Rb_tree<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_kratos::color::Color>,_std::_Select1st<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>,_std::less<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_kratos::color::Color>_>_>
               *)&stream.field_0x180);
  std::_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~_Vector_base
            ((_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_e8);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::stringstream::~stringstream(local_2f8);
  return __return_storage_ptr__;
}

Assistant:

std::string FSM::dot_graph() {
    constexpr char indent[] = "    ";  // NOLINT
    std::stringstream stream;

    // header
    stream << "digraph " << fsm_name_ << " {" << endl;
    stream << indent << "rankdir=LR;" << ::endl << ::endl;

    // start state is double circle
    std::string start_state_name;
    if (start_state_) start_state_name = start_state_->handle_name();
    // we include extra states to draw the extra state transition diagram
    auto states = get_all_child_states(true);
    auto state_colors = get_state_color(states);
    if (!start_state_name.empty()) {
        auto color = state_colors.at(start_state_.get());
        auto color_str = ::format("#{0:02X}{1:02X}{2:02X}", color.R, color.G, color.B);
        stream
            << indent
            << ::format(
                   R"(node [shape=doublecircle, label="{0}", style=filled, fillcolor="{1}"] {0};)",
                   start_state_->handle_name(), color_str)
            << ::endl;
    }
    // the rest of the states
    for (auto const& iter : states) {
        auto state_name = iter->handle_name();
        if (state_name == start_state_name) continue;
        auto color = state_colors.at(iter);
        auto color_str = ::format("#{0:02X}{1:02X}{2:02X}", color.R, color.G, color.B);
        stream << indent
               << ::format(
                      R"(node [shape=circle, label="{0}", style=filled, fillcolor="{1}"] {0};)",
                      state_name, color_str)
               << ::endl;
    }

    stream << ::endl;
    // state transition
    for (auto const& state : states) {
        auto const &transitions = state->transitions();
        auto state_name = state->handle_name();
        // deterministic sorting
        for (auto [cond, next_state] : transitions) {
            if (cond) {
                stream << indent
                       << ::format("{0}    ->  {1} [ label = \"{2}\" ];", state_name,
                                   next_state->handle_name(), cond->to_string())
                       << ::endl;
            } else {
                stream << indent
                       << ::format("{0}    ->  {1};", state_name, next_state->handle_name())
                       << ::endl;
            }
        }
    }
    stream << "}" << ::endl;

    return stream.str();
}